

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O0

void __thiscall el::Logger::configure(Logger *this,Configurations *configurations)

{
  bool bVar1;
  undefined1 uVar2;
  void *pvVar3;
  Configurations *in_RSI;
  Configurations *in_RDI;
  Configurations *unaff_retaddr;
  Logger *in_stack_00000010;
  Logger *in_stack_00000020;
  ScopedLock scopedLock;
  Configurations *c;
  NoMutex *in_stack_ffffffffffffffb8;
  undefined7 in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc7;
  NoScopedLock<el::base::threading::internal::NoMutex> in_stack_ffffffffffffffe0;
  Configurations *in_stack_ffffffffffffffe8;
  Configurations *base;
  
  in_RDI[6].super_RegistryWithPred<el::Configuration,_el::Configuration::Predicate>.
  super_AbstractRegistry<el::Configuration,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
  .super_ThreadSafe.field_0x8 = 0;
  base = in_RDI;
  initUnflushedCount(in_stack_00000010);
  if ((in_RDI->m_configurationFile).field_2._M_allocated_capacity != 0) {
    in_stack_ffffffffffffffe8 =
         el::base::TypedConfigurations::configurations
                   ((TypedConfigurations *)
                    (in_RDI->m_configurationFile).field_2._M_allocated_capacity);
    bVar1 = Configurations::hasConfiguration
                      (in_RSI,(Level)((ulong)in_stack_ffffffffffffffe8 >> 0x20),
                       (ConfigurationType)in_stack_ffffffffffffffe8);
    if (bVar1) {
      flush(in_stack_00000020);
    }
  }
  (*(in_RDI->super_RegistryWithPred<el::Configuration,_el::Configuration::Predicate>).
    super_AbstractRegistry<el::Configuration,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
    .super_ThreadSafe._vptr_ThreadSafe[2])();
  el::base::threading::internal::NoScopedLock<el::base::threading::internal::NoMutex>::NoScopedLock
            ((NoScopedLock<el::base::threading::internal::NoMutex> *)
             CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0),in_stack_ffffffffffffffb8
            );
  uVar2 = el::base::utils::
          AbstractRegistry<el::Configuration,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
          ::operator!=((AbstractRegistry<el::Configuration,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
                        *)in_stack_ffffffffffffffe8,
                       (AbstractRegistry<el::Configuration,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
                        *)in_stack_ffffffffffffffe0._vptr_NoScopedLock);
  if ((bool)uVar2) {
    Configurations::setFromBase(unaff_retaddr,base);
  }
  el::base::utils::safeDelete<el::base::TypedConfigurations>
            ((TypedConfigurations **)CONCAT17(uVar2,in_stack_ffffffffffffffc0));
  pvVar3 = operator_new(0x200);
  el::base::TypedConfigurations::TypedConfigurations
            ((TypedConfigurations *)c,(Configurations *)scopedLock._vptr_NoScopedLock,
             (LogStreamsReferenceMap *)in_stack_00000020);
  (in_RDI->m_configurationFile).field_2._M_allocated_capacity = (size_type)pvVar3;
  resolveLoggerFormatSpec(in_stack_00000010);
  in_RDI[6].super_RegistryWithPred<el::Configuration,_el::Configuration::Predicate>.
  super_AbstractRegistry<el::Configuration,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
  .super_ThreadSafe.field_0x8 = 1;
  el::base::threading::internal::NoScopedLock<el::base::threading::internal::NoMutex>::~NoScopedLock
            ((NoScopedLock<el::base::threading::internal::NoMutex> *)&stack0xffffffffffffffe0);
  return;
}

Assistant:

void Logger::configure(const Configurations& configurations) {
  m_isConfigured = false;  // we set it to false in case if we fail
  initUnflushedCount();
  if (m_typedConfigurations != nullptr) {
    Configurations* c = const_cast<Configurations*>(m_typedConfigurations->configurations());
    if (c->hasConfiguration(Level::Global, ConfigurationType::Filename)) {
      // This check is definitely needed for cases like ELPP_NO_DEFAULT_LOG_FILE
      flush();
    }
  }
  base::threading::ScopedLock scopedLock(lock());
  if (m_configurations != configurations) {
    m_configurations.setFromBase(const_cast<Configurations*>(&configurations));
  }
  base::utils::safeDelete(m_typedConfigurations);
  m_typedConfigurations = new base::TypedConfigurations(&m_configurations, m_logStreamsReference);
  resolveLoggerFormatSpec();
  m_isConfigured = true;
}